

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::BP5Reader::CheckForNewSteps(BP5Reader *this,Seconds timeoutSeconds)

{
  bool bVar1;
  duration<double,_std::ratio<1L,_1L>_> *in_RDI;
  BP5Reader *in_XMM0_Qa;
  duration<double,_std::ratio<1L,_1L>_> this_00;
  duration<double,_std::ratio<1L,_1L>_> pollSeconds_00;
  size_t stepsBefore;
  Seconds pollSeconds;
  TimePoint timeoutInstant;
  StepStatus retval;
  Seconds *in_stack_000005c8;
  Seconds *in_stack_000005d0;
  TimePoint *in_stack_000005d8;
  BP5Reader *in_stack_000005e0;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  TimePoint *timeoutInstant_00;
  BP5Reader *in_stack_ffffffffffffffb8;
  int local_2c;
  BP5Reader *local_28;
  StepStatus local_14;
  BP5Reader *local_8;
  
  this_00 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  bVar1 = std::chrono::operator<
                    ((duration<double,_std::ratio<1L,_1L>_> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff98);
  local_8 = in_XMM0_Qa;
  if (bVar1) {
    local_2c = 999999999;
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<int,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_28,&local_2c);
    local_8 = local_28;
  }
  Now();
  std::chrono::operator+
            (in_stack_ffffffffffffff98,
             (duration<double,_std::ratio<1L,_1L>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<float,void>
            ((duration<double,std::ratio<1l,1l>> *)&stack0xffffffffffffffb8,
             (float *)((long)&in_RDI[0x2c].__r + 4));
  bVar1 = std::chrono::operator>
                    ((duration<double,_std::ratio<1L,_1L>_> *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI);
  if (!bVar1) {
    local_8 = in_stack_ffffffffffffffb8;
  }
  timeoutInstant_00 = (TimePoint *)in_RDI[0xac].__r;
  do {
    pollSeconds_00 =
         std::chrono::operator/
                   ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff98,
                    (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    UpdateBuffer(in_stack_000005e0,in_stack_000005d8,in_stack_000005d0,in_stack_000005c8);
    if (timeoutInstant_00 < (TimePoint *)in_RDI[0xac].__r) break;
    bVar1 = CheckWriterActive((BP5Reader *)this_00.__r);
    if (!bVar1) {
      std::chrono::operator/
                ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff98,
                 (int *)CONCAT44(10,in_stack_ffffffffffffff90));
      UpdateBuffer(in_stack_000005e0,in_stack_000005d8,in_stack_000005d0,in_stack_000005c8);
      break;
    }
    bVar1 = SleepOrQuit(local_8,timeoutInstant_00,(Seconds *)pollSeconds_00.__r);
  } while (bVar1);
  if (timeoutInstant_00 < (TimePoint *)in_RDI[0xac].__r) {
    local_14 = OK;
  }
  else {
    *(undefined1 *)((long)in_RDI[5].__r + 200) = 0;
    if (((ulong)in_RDI[0x8d].__r & 1) == 0) {
      local_14 = EndOfStream;
    }
    else {
      local_14 = NotReady;
    }
  }
  return local_14;
}

Assistant:

StepStatus BP5Reader::CheckForNewSteps(Seconds timeoutSeconds)
{
    /* Do a collective wait for a step within timeout.
       Make sure every reader comes to the same conclusion */
    StepStatus retval = StepStatus::OK;

    if (timeoutSeconds < Seconds::zero())
    {
        timeoutSeconds = Seconds(999999999); // max 1 billion seconds wait
    }
    const TimePoint timeoutInstant = Now() + timeoutSeconds;

    auto pollSeconds = Seconds(m_Parameters.BeginStepPollingFrequencySecs);
    if (pollSeconds > timeoutSeconds)
    {
        pollSeconds = timeoutSeconds;
    }

    /* Poll */
    const auto stepsBefore = m_StepsCount;
    do
    {
        UpdateBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);
        if (m_StepsCount > stepsBefore)
        {
            break;
        }
        if (!CheckWriterActive())
        {
            /* Race condition: When checking data in UpdateBuffer, new
             * step(s) may have not arrived yet. When checking active flag,
             * the writer may have completed write and terminated. So we may
             * have missed a step or two. */
            UpdateBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);
            break;
        }
    } while (SleepOrQuit(timeoutInstant, pollSeconds));

    if (m_StepsCount > stepsBefore)
    {
        /* we have got new steps and new metadata in memory */
        retval = StepStatus::OK;
    }
    else
    {
        m_IO.m_ReadStreaming = false;
        if (m_WriterIsActive)
        {
            retval = StepStatus::NotReady;
        }
        else
        {
            retval = StepStatus::EndOfStream;
        }
    }
    return retval;
}